

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::SetToken
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignedToken,
          bool aAlwaysAccept)

{
  bool bVar1;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_22;
  undefined1 local_21;
  ByteArray *pBStack_20;
  bool aAlwaysAccept_local;
  ByteArray *aSignedToken_local;
  TokenManager *this_local;
  Error *error;
  
  local_22 = 0;
  local_21 = aAlwaysAccept;
  pBStack_20 = aSignedToken;
  aSignedToken_local = (ByteArray *)this;
  this_local = (TokenManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  ValidateToken(&local_50,this,pBStack_20,&this->mDomainCAPublicKey);
  Error::operator=(__return_storage_ptr__,&local_50);
  Error::~Error(&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(__return_storage_ptr__,local_60);
  if (!bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->mSignedToken,pBStack_20);
    this->mSequenceNumber = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::SetToken(const ByteArray &aSignedToken, bool aAlwaysAccept)
{
    Error error;

    (void)aAlwaysAccept;
    error = ValidateToken(aSignedToken, mDomainCAPublicKey);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    if (aAlwaysAccept)
    {
        if (error != ErrorCode::kNone)
        {
            LOG_WARN(LOG_REGION_TOKEN_MANAGER, "validating token failed: {}", error.ToString());
        }
        SuccessOrExit(error = ERROR_NONE);
    }
    else
#endif
    {
        SuccessOrExit(error);
    }

    mSignedToken    = aSignedToken;
    mSequenceNumber = 0;
exit:
    return error;
}